

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegExp.cc
# Opt level: O0

bool __thiscall flow::util::RegExp::match(RegExp *this,string *target,Result *result)

{
  bool bVar1;
  Result *result_local;
  string *target_local;
  RegExp *this_local;
  
  std::
  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            (target,result,&this->re_,0);
  bVar1 = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::empty(result);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool RegExp::match(const std::string& target, Result* result) const {
  std::regex_search(target, *result, re_);
  return !result->empty();
}